

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O3

bool __thiscall dlib::thread_pool_implementation::is_task_thread(thread_pool_implementation *this)

{
  size_t sVar1;
  pthread_t pVar2;
  size_t sVar3;
  bool bVar4;
  auto_mutex M;
  auto_mutex local_20;
  
  local_20.m = &this->m;
  local_20.r = (rmutex *)0x0;
  local_20.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_20.m);
  pVar2 = pthread_self();
  sVar1 = (this->worker_thread_ids).array_size;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      if ((this->worker_thread_ids).array_elements[sVar3] == pVar2) {
        bVar4 = true;
        goto LAB_001a4edb;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  bVar4 = (this->tasks).array_size == 0;
LAB_001a4edb:
  auto_mutex::unlock(&local_20);
  return bVar4;
}

Assistant:

bool thread_pool_implementation::
    is_task_thread (
    ) const
    {
        auto_mutex M(m);
        return is_worker_thread(get_thread_id());
    }